

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O2

void btree_update_meta(btree *btree,btree_meta *meta)

{
  void *pvVar1;
  ushort uVar2;
  int iVar3;
  voidref addr;
  bnode *pbVar4;
  size_t sVar5;
  ushort uVar6;
  ulong uVar7;
  ulong uVar8;
  ushort uVar9;
  
  addr = (*btree->blk_ops->blk_read)(btree->blk_handle,btree->root_bid);
  pbVar4 = _fetch_bnode(btree,addr,btree->height);
  if ((pbVar4->flag & 2) == 0) {
    if (meta == (btree_meta *)0x0) goto LAB_0010991e;
    uVar9 = meta->size;
    uVar6 = 0xffff;
    uVar2 = uVar9;
  }
  else {
    uVar6 = pbVar4[1].kvsize;
    uVar6 = uVar6 << 8 | uVar6 >> 8;
    if (meta == (btree_meta *)0x0) {
      pvVar1 = (pbVar4->field_4).data;
      sVar5 = (*btree->kv_ops->get_data_size)(pbVar4,(void *)0x0,(void *)0x0,(void *)0x0,0);
      memmove(pbVar4 + 1,pvVar1,sVar5);
      (pbVar4->field_4).data =
           (void *)((long)(pbVar4->field_4).data - (ulong)(uVar6 + 0x11 & 0xfffffff0));
      *(byte *)&pbVar4->flag = (byte)pbVar4->flag & 0xfd;
      goto LAB_0010991e;
    }
    uVar9 = meta->size;
    uVar2 = uVar9;
    if (uVar6 < uVar9) {
      fdb_assert_die("metasize <= old_metasize",
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/btree.cc"
                     ,0x127,(ulong)uVar9,(ulong)uVar6);
      uVar2 = meta->size;
    }
  }
  if (uVar2 == 0) {
    uVar2 = pbVar4->flag & 0xfffd;
  }
  else {
    pbVar4[1].kvsize = uVar9 << 8 | uVar9 >> 8;
    memcpy(&pbVar4[1].flag,meta->data,(ulong)uVar9);
    uVar2 = pbVar4->flag | 2;
  }
  pbVar4->flag = uVar2;
  uVar8 = (ulong)(uVar9 + 0x11 & 0xfffffff0);
  uVar7 = (ulong)(uVar6 + 0x11 & 0xfffffff0);
  if (uVar8 - 2 < uVar7 - 2) {
    pvVar1 = (pbVar4->field_4).data;
    sVar5 = (*btree->kv_ops->get_data_size)(pbVar4,(void *)0x0,(void *)0x0,(void *)0x0,0);
    memmove((void *)((long)&pbVar4[1].kvsize + uVar8),pvVar1,sVar5);
    (pbVar4->field_4).data = (void *)((long)(pbVar4->field_4).data + (uVar8 - uVar7));
  }
LAB_0010991e:
  iVar3 = (*btree->blk_ops->blk_is_writable)(btree->blk_handle,btree->root_bid);
  if (iVar3 == 0) {
    (*btree->blk_ops->blk_move)(btree->blk_handle,btree->root_bid,&btree->root_bid);
    return;
  }
  (*btree->blk_ops->blk_set_dirty)(btree->blk_handle,btree->root_bid);
  return;
}

Assistant:

void btree_update_meta(struct btree *btree, struct btree_meta *meta)
{
    void *addr;
    void *ptr;
    metasize_t metasize, _metasize;
    metasize_t old_metasize = (metasize_t)(-1);
    struct bnode *node;

    // read root node
    addr = btree->blk_ops->blk_read(btree->blk_handle, btree->root_bid);
    node = _fetch_bnode(btree, addr, btree->height);

    ptr = ((uint8_t *)node) + sizeof(struct bnode);

    if (node->flag & BNODE_MASK_METADATA) {
        memcpy(&old_metasize, ptr, sizeof(metasize_t));
        old_metasize = _endian_decode(old_metasize);
    }

    if (meta) {
        metasize = meta->size;

        // new meta size cannot be larger than old meta size
        fdb_assert(metasize <= old_metasize, metasize, old_metasize);
        (void)metasize;

        // overwrite
        if (meta->size > 0) {
            _metasize = _endian_encode(metasize);
            memcpy(ptr, &_metasize, sizeof(metasize_t));
            memcpy((uint8_t *)ptr + sizeof(metasize_t), meta->data, metasize);
            node->flag |= BNODE_MASK_METADATA;
        }else{
            // clear the flag
            node->flag &= ~BNODE_MASK_METADATA;
        }
        // move kv-pairs (only if meta size is changed)
        if (_metasize_align(metasize) < _metasize_align(old_metasize)){
            memmove(
                (uint8_t *)ptr + sizeof(metasize_t) + _metasize_align(metasize),
                node->data,
                btree->kv_ops->get_data_size(node, NULL, NULL, NULL, 0));
            node->data = (uint8_t *)node->data - (_metasize_align(old_metasize) -
                         _metasize_align(metasize));
        }

    }else {
        if (node->flag & BNODE_MASK_METADATA) {
            // existing metadata is removed
            memmove(ptr, node->data, btree->kv_ops->get_data_size(node,
                                                    NULL, NULL, NULL, 0));
            node->data = (uint8_t *)node->data - (_metasize_align(old_metasize) +
                         sizeof(metasize_t));
            // clear the flag
            node->flag &= ~BNODE_MASK_METADATA;
        }
    }

    if (!btree->blk_ops->blk_is_writable(btree->blk_handle, btree->root_bid)) {
        // already flushed block -> cannot overwrite, we have to move to new block
        btree->blk_ops->blk_move(btree->blk_handle, btree->root_bid,
                                &btree->root_bid);
    }else{
        btree->blk_ops->blk_set_dirty(btree->blk_handle, btree->root_bid);
    }
}